

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O1

int wally_base58_to_bytes(char *str_in,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  ulong uVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  size_t base58_len;
  uint32_t checksum;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar4 = -2;
  if (((str_in != (char *)0x0) &&
      ((flags < 2 && written != (size_t *)0x0) && (len != 0 && bytes_out != (uchar *)0x0))) &&
     (flags == 0 || 4 < len)) {
    *written = len;
    base58_len = strlen(str_in);
    iVar2 = base58_decode(str_in,base58_len,bytes_out,written);
    iVar4 = iVar2;
    if (iVar2 == 0) {
      uVar1 = *written;
      iVar4 = 0;
      if (uVar1 <= len) {
        iVar4 = iVar2;
      }
      if (uVar1 <= len && flags != 0) {
        if ((uVar1 < 5) ||
           (uVar3 = base58_get_checksum(bytes_out,uVar1 - 4),
           *(uint32_t *)(bytes_out + (uVar1 - 4)) != uVar3)) {
          wally_clear(bytes_out,len);
          iVar4 = -2;
        }
        else {
          wally_clear(bytes_out + (uVar1 - 4),4);
          *written = *written - 4;
          iVar4 = iVar2;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int wally_base58_to_bytes(const char *str_in, uint32_t flags,
                          unsigned char *bytes_out, size_t len,
                          size_t *written)
{
    size_t offset;
    uint32_t checksum;
    int ret;

    if (written)
        *written = 0;

    if (!str_in || flags & ~BASE58_ALL_DEFINED_FLAGS ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & BASE58_FLAG_CHECKSUM && len <= BASE58_CHECKSUM_LEN)
        return WALLY_EINVAL; /* No room for checksum */

    *written = len;
    ret = base58_decode(str_in, strlen(str_in), bytes_out, written);
    if (!ret && *written > len)
        return WALLY_OK; /* not enough space, return required amount */

    if (!ret && (flags & BASE58_FLAG_CHECKSUM)) {
        if (*written <= BASE58_CHECKSUM_LEN) {
            wally_clear(bytes_out, len);
            return WALLY_EINVAL; /* Input not long enough to contain a checksum */
        }

        offset = *written - BASE58_CHECKSUM_LEN;
        checksum = base58_get_checksum(bytes_out, offset);

        if (memcmp(bytes_out + offset, &checksum, sizeof(checksum))) {
            wally_clear(bytes_out, len);
            return WALLY_EINVAL; /* Checksum mismatch */
        }

        wally_clear(bytes_out + offset, BASE58_CHECKSUM_LEN);
        *written -= BASE58_CHECKSUM_LEN;
    }
    return ret;
}